

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O3

int32_t __thiscall xla::GraphCycles::NewNode(GraphCycles *this)

{
  pointer *ppNVar1;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_00;
  unordered_map<int,_int,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_int>_>_>
  *this_01;
  pointer *pppvVar2;
  pointer *ppNVar3;
  undefined8 *puVar4;
  Rep *pRVar5;
  pointer piVar6;
  pointer __src;
  pointer __s;
  pointer pNVar7;
  iterator __position;
  pointer pNVar8;
  pointer pNVar9;
  ulong uVar10;
  pointer pNVar11;
  ulong uVar12;
  long lVar13;
  pointer pNVar14;
  int iVar15;
  ulong uVar16;
  ulong uVar17;
  size_t __n;
  pointer pNVar18;
  void *local_38;
  
  pRVar5 = this->rep_;
  piVar6 = (pRVar5->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if ((pRVar5->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start == piVar6) {
    __src = (pRVar5->nodes_).
            super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
            ._M_impl.super__Vector_impl_data._M_start;
    pNVar9 = (pRVar5->nodes_).
             super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    __n = (long)pNVar9 - (long)__src;
    uVar16 = (long)__n >> 3;
    if (pNVar9 == (pRVar5->nodes_).
                  super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      if (__n == 0x7ffffffffffffff8) goto LAB_001980b9;
      uVar10 = 1;
      if (pNVar9 != __src) {
        uVar10 = uVar16;
      }
      uVar12 = uVar10 + uVar16;
      if (0xffffffffffffffe < uVar12) {
        uVar12 = 0xfffffffffffffff;
      }
      if (CARRY8(uVar10,uVar16)) {
        uVar12 = 0xfffffffffffffff;
      }
      if (uVar12 == 0) {
        pNVar9 = (pointer)0x0;
      }
      else {
        pNVar9 = (pointer)operator_new(uVar12 * 8);
      }
      pNVar9[uVar16] = (Node)(uVar16 & 0xffffffff);
      if (0 < (long)__n) {
        memmove(pNVar9,__src,__n);
      }
      if (__src != (pointer)0x0) {
        operator_delete(__src,(long)(pRVar5->nodes_).
                                    super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)__src
                       );
      }
      (pRVar5->nodes_).
      super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
      ._M_impl.super__Vector_impl_data._M_start = pNVar9;
      (pRVar5->nodes_).
      super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)((long)pNVar9 + __n + 8);
      (pRVar5->nodes_).
      super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pNVar9 + uVar12;
    }
    else {
      *pNVar9 = (Node)(uVar16 & 0xffffffff);
      ppNVar1 = &(pRVar5->nodes_).
                 super__Vector_base<xla::(anonymous_namespace)::Node,_std::allocator<xla::(anonymous_namespace)::Node>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppNVar1 = *ppNVar1 + 1;
    }
    pRVar5 = this->rep_;
    __s = (pRVar5->node_io_).
          super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    if (__s == (pRVar5->node_io_).
               super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      pNVar7 = (pRVar5->node_io_).
               super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar13 = (long)__s - (long)pNVar7;
      if (lVar13 == 0x7fffffffffffff80) {
LAB_001980b9:
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar12 = (lVar13 >> 5) * -0x3333333333333333;
      uVar10 = uVar12;
      if (__s == pNVar7) {
        uVar10 = 1;
      }
      uVar17 = uVar10 + uVar12;
      if (0xcccccccccccccb < uVar17) {
        uVar17 = 0xcccccccccccccc;
      }
      if (CARRY8(uVar10,uVar12)) {
        uVar17 = 0xcccccccccccccc;
      }
      pNVar11 = (pointer)operator_new(uVar17 * 0xa0);
      memset((void *)((long)pNVar11 + lVar13),0,0x90);
      *(long *)((long)pNVar11 + lVar13 + 0x18) = (long)pNVar11 + lVar13 + 0x48;
      *(undefined8 *)((long)pNVar11 + lVar13 + 0x20) = 1;
      *(undefined8 *)((long)pNVar11 + lVar13 + 0x28) = 0;
      *(undefined8 *)((long)pNVar11 + lVar13 + 0x30) = 0;
      *(undefined4 *)((long)pNVar11 + lVar13 + 0x38) = 0x3f800000;
      puVar4 = (undefined8 *)((long)pNVar11 + lVar13 + 0x98);
      puVar4[-0xb] = 0;
      puVar4[-10] = 0;
      puVar4[-9] = 0;
      puVar4[-8] = 0;
      puVar4[-7] = 0;
      puVar4[-6] = puVar4;
      puVar4[-5] = 1;
      puVar4[-4] = 0;
      puVar4[-3] = 0;
      *(undefined4 *)(puVar4 + -2) = 0x3f800000;
      puVar4[-1] = 0;
      *puVar4 = 0;
      pNVar14 = pNVar7;
      pNVar8 = pNVar11;
      pNVar18 = pNVar11;
      if (__s != pNVar7) {
        do {
          pNVar18 = pNVar8;
          piVar6 = (pNVar14->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)&(pNVar18->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> =
               (pNVar14->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&(pNVar18->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 8)
               = piVar6;
          *(pointer *)
           ((long)&(pNVar18->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_> +
           0x10) = (pNVar14->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          (pNVar14->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pNVar14->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pNVar14->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          this_00 = &(pNVar14->in).value_to_index_;
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_Hashtable(&(pNVar18->in).value_to_index_._M_h,this_00,this_00);
          piVar6 = (pNVar14->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_finish;
          *(pointer *)
           &(pNVar18->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl =
               (pNVar14->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
          *(pointer *)
           ((long)&(pNVar18->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_> + 8)
               = piVar6;
          *(pointer *)
           ((long)&(pNVar18->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_> +
           0x10) = (pNVar14->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage;
          (pNVar14->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          (pNVar14->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (pNVar14->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          this_01 = &(pNVar14->out).value_to_index_;
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_Hashtable(&(pNVar18->out).value_to_index_._M_h,this_01,this_01);
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&this_01->_M_h);
          piVar6 = (pNVar14->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (piVar6 != (pointer)0x0) {
            operator_delete(piVar6,(long)(pNVar14->out).value_sequence_.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage - (long)piVar6);
          }
          std::
          _Hashtable<int,_std::pair<const_int,_int>,_std::allocator<std::pair<const_int,_int>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable(&this_00->_M_h);
          piVar6 = (pNVar14->in).value_sequence_.super__Vector_base<int,_std::allocator<int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          if (piVar6 != (pointer)0x0) {
            operator_delete(piVar6,(long)(pNVar14->in).value_sequence_.
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_end_of_storage - (long)piVar6);
          }
          pNVar14 = pNVar14 + 1;
          pNVar8 = pNVar18 + 1;
        } while (pNVar14 != __s);
        pNVar18 = pNVar18 + 1;
      }
      if (pNVar7 != (pointer)0x0) {
        operator_delete(pNVar7,(long)(pRVar5->node_io_).
                                     super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pNVar7);
      }
      (pRVar5->node_io_).
      super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
      ._M_impl.super__Vector_impl_data._M_start = pNVar11;
      (pRVar5->node_io_).
      super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
      ._M_impl.super__Vector_impl_data._M_finish = pNVar18 + 1;
      (pRVar5->node_io_).
      super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = pNVar11 + uVar17;
    }
    else {
      memset(__s,0,0x90);
      (__s->in).value_to_index_._M_h._M_buckets = &(__s->in).value_to_index_._M_h._M_single_bucket;
      (__s->in).value_to_index_._M_h._M_bucket_count = 1;
      (__s->in).value_to_index_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__s->in).value_to_index_._M_h._M_element_count = 0;
      (__s->in).value_to_index_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (__s->in).value_to_index_._M_h._M_rehash_policy._M_next_resize = 0;
      (__s->in).value_to_index_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      (__s->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      (__s->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      (__s->out).value_sequence_.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__s->out).value_to_index_._M_h._M_buckets = &(__s->out).value_to_index_._M_h._M_single_bucket
      ;
      (__s->out).value_to_index_._M_h._M_bucket_count = 1;
      (__s->out).value_to_index_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
      (__s->out).value_to_index_._M_h._M_element_count = 0;
      (__s->out).value_to_index_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
      (__s->out).value_to_index_._M_h._M_rehash_policy._M_next_resize = 0;
      (__s->out).value_to_index_._M_h._M_single_bucket = (__node_base_ptr)0x0;
      ppNVar3 = &(pRVar5->node_io_).
                 super__Vector_base<xla::(anonymous_namespace)::NodeIO,_std::allocator<xla::(anonymous_namespace)::NodeIO>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *ppNVar3 = *ppNVar3 + 1;
    }
    iVar15 = (int)uVar16;
    pRVar5 = this->rep_;
    local_38 = (void *)0x0;
    __position._M_current =
         (pRVar5->node_data_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (pRVar5->node_data_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<void*,std::allocator<void*>>::_M_realloc_insert<void*>
                ((vector<void*,std::allocator<void*>> *)&pRVar5->node_data_,__position,&local_38);
    }
    else {
      *__position._M_current = (void *)0x0;
      pppvVar2 = &(pRVar5->node_data_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppvVar2 = *pppvVar2 + 1;
    }
  }
  else {
    iVar15 = piVar6[-1];
    (pRVar5->free_nodes_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar6 + -1;
    (pRVar5->node_data_).super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
    super__Vector_impl_data._M_start[iVar15] = (void *)0x0;
  }
  return iVar15;
}

Assistant:

int32_t GraphCycles::NewNode() {
  if (rep_->free_nodes_.empty()) {
    Node n;
    n.visited = false;
    n.rank = static_cast<int32_t>(rep_->nodes_.size());
    rep_->nodes_.emplace_back(n);
    rep_->node_io_.emplace_back();
    rep_->node_data_.push_back(nullptr);
    return n.rank;
  } else {
    // Preserve preceding rank since the set of ranks in use must be
    // a permutation of [0,rep_->nodes_.size()-1].
    int32_t r = rep_->free_nodes_.back();
    rep_->free_nodes_.pop_back();
    rep_->node_data_[r] = nullptr;
    return r;
  }
}